

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinc_resampler.cc
# Opt level: O1

float webrtc::SincResampler::Convolve_C
                (float *input_ptr,float *k1,float *k2,double kernel_interpolation_factor)

{
  long lVar1;
  float fVar2;
  float fVar3;
  
  fVar2 = 0.0;
  lVar1 = 0;
  fVar3 = 0.0;
  do {
    fVar3 = fVar3 + k1[lVar1] * input_ptr[lVar1];
    fVar2 = fVar2 + input_ptr[lVar1] * k2[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x20);
  return (float)((double)fVar2 * kernel_interpolation_factor +
                (double)fVar3 * (1.0 - kernel_interpolation_factor));
}

Assistant:

float SincResampler::Convolve_C(const float* input_ptr, const float* k1,
                                const float* k2,
                                double kernel_interpolation_factor) {
  float sum1 = 0;
  float sum2 = 0;

  // Generate a single output sample.  Unrolling this loop hurt performance in
  // local testing.
  size_t n = kKernelSize;
  while (n--) {
    sum1 += *input_ptr * *k1++;
    sum2 += *input_ptr++ * *k2++;
  }

  // Linearly interpolate the two "convolutions".
  return static_cast<float>((1.0 - kernel_interpolation_factor) * sum1 +
      kernel_interpolation_factor * sum2);
}